

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__service;
  bool bVar2;
  bool bVar3;
  ptls_key_exchange_algorithm_t **pppVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  FILE *pFVar10;
  EVP_PKEY *pEVar11;
  char **ppcVar12;
  ptls_key_exchange_algorithm_t **pppVar13;
  size_t sVar14;
  ptls_esni_context_t **pppVar15;
  ptls_esni_context_t *esni;
  int request_key_update;
  ptls_key_exchange_context_t **ctx_00;
  char *pcVar16;
  char *pcVar17;
  byte *__dest;
  long lVar18;
  ulong __n;
  ptls_key_exchange_algorithm_t *ppVar19;
  byte *pbVar20;
  char **ppcVar21;
  bool bVar22;
  ptls_iovec_t esni_keys;
  ptls_buffer_t decode_buf;
  ptls_handshake_properties_t hsprop;
  ptls_context_t ctx;
  sockaddr_storage sa;
  ns_msg msg;
  anon_struct_136_2_ecfa8f33 esni_key_exchanges;
  char esni_name [256];
  ptls_key_exchange_algorithm_t *key_exchanges [128];
  uint8_t answer [1024];
  addrinfo hints;
  int iStack_10c30;
  socklen_t sStack_10c2c;
  char *pcStack_10c20;
  ptls_buffer_t pStack_10c08;
  undefined1 auStack_10be8 [32];
  size_t *psStack_10bc8;
  undefined8 uStack_10bc0;
  undefined8 uStack_10bb8;
  undefined8 uStack_10bb0;
  undefined8 uStack_10ba8;
  undefined8 uStack_10ba0;
  undefined8 uStack_10b98;
  undefined8 uStack_10b90;
  undefined8 uStack_10b88;
  ptls_raw_extension_t *ppStack_10b80;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *p_Stack_10b78;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *p_Stack_10b70;
  ptls_context_t pStack_10b68;
  ptls_base64_decode_state_t pStack_10aa0;
  sockaddr asStack_10a90 [8];
  ns_msg anStack_10a10 [2];
  ptls_key_exchange_context_t *appStack_109c0 [16];
  long lStack_10940;
  char acStack_10938 [256];
  ptls_key_exchange_algorithm_t *appStack_10838 [128];
  addrinfo *apaStack_10438 [128];
  undefined1 auStack_10038 [32];
  char *pcStack_10018;
  addrinfo *paStack_10010;
  ushort local_fc2c;
  byte *local_fc28;
  
  OPENSSL_init_crypto(2);
  OPENSSL_init_crypto(0xc);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  __res_init();
  memset(appStack_10838,0,0x400);
  memset(&pStack_10b68,0,200);
  pStack_10b68.random_bytes = ptls_openssl_random_bytes;
  pStack_10b68.get_time = &ptls_get_time;
  pStack_10b68.cipher_suites = ptls_openssl_cipher_suites;
  p_Stack_10b78 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_10b70 =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0;
  uStack_10b88 = 0;
  ppStack_10b80 = (ptls_raw_extension_t *)0x0;
  uStack_10b98 = (uint8_t *)0x0;
  uStack_10b90 = 0;
  uStack_10ba8 = 0;
  uStack_10ba0 = (void *)0x0;
  uStack_10bb8 = (uint8_t *)0x0;
  uStack_10bb0 = 0;
  psStack_10bc8 = (size_t *)0x0;
  uStack_10bc0 = 0;
  auStack_10be8._16_8_ = (uint8_t *)0x0;
  auStack_10be8._24_8_ = (char **)0x0;
  auStack_10be8._0_8_ = (ptls_iovec_t *)0x0;
  auStack_10be8._8_8_ = 0;
  bVar3 = false;
  request_key_update = 0;
  bVar22 = false;
  pcStack_10c20 = (char *)0x0;
  iStack_10c30 = 0;
  pcVar16 = (char *)0x0;
  iVar8 = 0;
  pStack_10b68.key_exchanges = appStack_10838;
LAB_00106079:
  while (iVar5 = iVar8, iVar6 = getopt(argc,argv,"46abC:c:i:k:nN:es:SE:K:l:vh"), iVar7 = _optind,
        pcVar1 = _optarg, iVar8 = iVar5, iVar6 < 0x4e) {
    if (iVar6 < 0x43) {
      iVar8 = 2;
      if (iVar6 != 0x34) {
        if (iVar6 != 0x36) {
          if (iVar6 != -1) goto switchD_001060b1_caseD_64;
          if ((pStack_10b68.sign_certificate != (ptls_sign_certificate_t *)0x0) ==
              (pStack_10b68.certificates.count == 0)) {
            main_cold_10();
            goto LAB_00106aea;
          }
          lVar18 = (long)_optind;
          if (bVar22) {
            if (pStack_10b68.certificates.count != 0) {
              if (pStack_10b68.decompress_certificate == (ptls_decompress_certificate_t *)0x0) {
LAB_00106578:
                setup_session_cache_sc._0_8_ = encrypt_ticket_cb;
                pStack_10b68.ticket_lifetime = 0x15180;
                pStack_10b68.max_early_data_size = 0x2000;
                pStack_10b68.encrypt_ticket = (ptls_encrypt_ticket_t *)setup_session_cache_sc;
                goto LAB_001065c6;
              }
              iVar8 = ptls_init_compressed_certificate
                                (&main::ecc,pStack_10b68.certificates.list,
                                 pStack_10b68.certificates.count,(ptls_iovec_t)ZEXT816(0));
              if (iVar8 == 0) {
                pStack_10b68.emit_certificate = &main::ecc.super;
                goto LAB_00106578;
              }
              goto LAB_00106b6e;
            }
            main_cold_12();
            goto LAB_00106aea;
          }
          if (bVar3) {
            psStack_10bc8 = &main::max_early_data_size;
          }
LAB_001065c6:
          if (appStack_10838[0] == (ptls_key_exchange_algorithm_t *)0x0) {
            appStack_10838[0] = &ptls_openssl_secp256r1;
          }
          if (pcStack_10c20 != (char *)0x0) {
            if (lStack_10940 != 0) {
              pFVar10 = fopen(pcStack_10c20,"rb");
              if (pFVar10 == (FILE *)0x0) goto LAB_00106b58;
              sVar14 = fread(auStack_10038,1,0x10000,pFVar10);
              if ((sVar14 == 0) || (iVar8 = feof(pFVar10), iVar8 == 0)) goto LAB_00106b49;
              fclose(pFVar10);
              pppVar15 = (ptls_esni_context_t **)malloc(0x10);
              pStack_10b68.esni = pppVar15;
              if (pppVar15 == (ptls_esni_context_t **)0x0) goto LAB_00106b53;
              esni = (ptls_esni_context_t *)malloc(0x28);
              *pppVar15 = esni;
              if (esni == (ptls_esni_context_t *)0x0) goto LAB_00106b53;
              esni_keys.len = sVar14;
              esni_keys.base = auStack_10038;
              iVar8 = ptls_esni_init_context(&pStack_10b68,esni,esni_keys,appStack_109c0);
              if (iVar8 == 0) goto LAB_001066bc;
              goto LAB_00106b62;
            }
            main_cold_17();
            goto LAB_00106aea;
          }
LAB_001066bc:
          if (argc - iVar7 != 2) {
            main_cold_18();
            goto LAB_00106aea;
          }
          pcVar1 = argv[lVar18];
          __service = argv[lVar18 + 1];
          auStack_10038._16_8_ = 0;
          auStack_10038._24_8_ = (sockaddr *)0x0;
          pcStack_10018 = (char *)0x0;
          paStack_10010 = (addrinfo *)0x0;
          auStack_10038._8_4_ = 1;
          auStack_10038._12_4_ = 6;
          auStack_10038._4_4_ = iVar5;
          auStack_10038._0_4_ = 0x421;
          iVar8 = getaddrinfo(pcVar1,__service,(addrinfo *)auStack_10038,apaStack_10438);
          pFVar10 = _stderr;
          if (apaStack_10438[0] == (addrinfo *)0x0 || iVar8 != 0) {
            if (iVar8 == 0) {
              pcVar17 = "getaddrinfo returned NULL";
            }
            else {
              pcVar17 = gai_strerror(iVar8);
            }
            fprintf(pFVar10,"failed to resolve address:%s:%s:%s\n",pcVar1,__service,pcVar17);
            sStack_10c2c = argc;
          }
          else {
            memcpy(asStack_10a90,apaStack_10438[0]->ai_addr,(ulong)apaStack_10438[0]->ai_addrlen);
            sStack_10c2c = apaStack_10438[0]->ai_addrlen;
            freeaddrinfo(apaStack_10438[0]);
          }
          if (apaStack_10438[0] == (addrinfo *)0x0 || iVar8 != 0) goto switchD_001060b1_caseD_64;
          if (bVar22) {
            auStack_10038._0_4_ = 1;
            iVar8 = socket((uint)asStack_10a90[0].sa_family,1,0);
            if (iVar8 == -1) goto LAB_001069ad;
            iVar7 = setsockopt(iVar8,1,2,auStack_10038,4);
            if (iVar7 == 0) {
              iVar7 = bind(iVar8,asStack_10a90,sStack_10c2c);
              if (iVar7 == 0) {
                iVar7 = listen(iVar8,0x1000);
                if (iVar7 == 0) {
                  do {
                    do {
                      iVar7 = accept(iVar8,(sockaddr *)0x0,(socklen_t *)0x0);
                    } while (iVar7 == -1);
                    handle_connection(iVar7,&pStack_10b68,(char *)0x0,pcVar16,
                                      (ptls_handshake_properties_t *)auStack_10be8,
                                      request_key_update);
                  } while( true );
                }
                pcVar16 = "listen(2) failed";
              }
              else {
                pcVar16 = "bind(2) failed";
              }
            }
            else {
              pcVar16 = "setsockopt(SO_REUSEADDR) failed";
            }
            goto LAB_00106a03;
          }
          pStack_10c08.base = "";
          pStack_10c08.capacity = 0;
          pStack_10c08.off = 0;
          pStack_10c08._24_8_ = pStack_10c08._24_8_ & 0xffffffff00000000;
          uVar9 = snprintf(acStack_10938,0x100,"_esni.%s");
          if (((((0xff < uVar9) ||
                (iVar8 = res_query(acStack_10938,1,0x10,apaStack_10438,0x400), iVar8 < 1)) ||
               (iVar8 = ns_initparse((u_char *)apaStack_10438,iVar8,anStack_10a10), iVar8 != 0)) ||
              ((anStack_10a10[0]._22_2_ == 0 ||
               (iVar8 = ns_parserr(anStack_10a10,ns_s_an,0,(ns_rr *)auStack_10038), iVar8 != 0))))
             || ((ulong)local_fc2c == 0)) goto LAB_001068db;
          __dest = local_fc28;
          pbVar20 = local_fc28;
          goto LAB_00106a5c;
        }
        iVar8 = 10;
      }
    }
    else {
      if (iVar6 == 0x43) goto switchD_001060b1_caseD_63;
      if (iVar6 == 0x45) {
        pcStack_10c20 = _optarg;
      }
      else {
        if (iVar6 != 0x4b) goto switchD_001060b1_caseD_64;
        pFVar10 = fopen(_optarg,"rt");
        if (pFVar10 == (FILE *)0x0) {
          main_cold_4();
LAB_001064c2:
          iStack_10c30 = 1;
          bVar2 = false;
        }
        else {
          pEVar11 = PEM_read_PrivateKey(pFVar10,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pEVar11 == (EVP_PKEY *)0x0) {
            main_cold_3();
            goto LAB_001064c2;
          }
          ctx_00 = appStack_109c0 + lStack_10940;
          lStack_10940 = lStack_10940 + 1;
          iVar7 = ptls_openssl_create_key_exchange(ctx_00,(EVP_PKEY *)pEVar11);
          if (iVar7 != 0) {
            main_cold_2();
            goto LAB_001064c2;
          }
          EVP_PKEY_free(pEVar11);
          fclose(pFVar10);
          bVar2 = true;
        }
        if (!bVar2) {
          return iStack_10c30;
        }
      }
    }
  }
  ppcVar21 = argv;
  switch(iVar6) {
  case 0x61:
    pStack_10b68._104_1_ = pStack_10b68._104_1_ | 8;
    goto LAB_00106079;
  case 0x62:
    pStack_10b68.decompress_certificate = &ptls_decompress_certificate;
    goto LAB_00106079;
  case 99:
switchD_001060b1_caseD_63:
    if (pStack_10b68.certificates.count != 0) {
      main_cold_8();
      goto LAB_00106aea;
    }
    iVar7 = ptls_load_certificates(&pStack_10b68,_optarg);
    if (iVar7 == 0) {
      bVar22 = iVar6 == 99;
      goto LAB_00106079;
    }
    main_cold_9();
    break;
  case 100:
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
    break;
  case 0x65:
    bVar3 = true;
    goto LAB_00106079;
  case 0x68:
    goto switchD_001060b1_caseD_68;
  case 0x69:
    pcVar16 = _optarg;
    goto LAB_00106079;
  case 0x6b:
    pFVar10 = fopen(_optarg,"rb");
    if (pFVar10 == (FILE *)0x0) goto LAB_00106b41;
    pEVar11 = PEM_read_PrivateKey(pFVar10,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
    fclose(pFVar10);
    if (pEVar11 == (EVP_PKEY *)0x0) goto LAB_00106b39;
    ptls_openssl_init_sign_certificate
              ((ptls_openssl_sign_certificate_t *)load_private_key_sc,(EVP_PKEY *)pEVar11);
    EVP_PKEY_free(pEVar11);
    pStack_10b68.sign_certificate = (ptls_sign_certificate_t *)load_private_key_sc;
    goto LAB_00106079;
  case 0x6c:
    setup_log_event_ls._8_8_ = fopen(_optarg,"at");
    if ((FILE *)setup_log_event_ls._8_8_ == (FILE *)0x0) {
      main_cold_1();
LAB_00106b39:
      main_cold_6();
LAB_00106b41:
      main_cold_7();
LAB_00106b49:
      main_cold_15();
LAB_00106b53:
      main_cold_14();
LAB_00106b58:
      main_cold_16();
LAB_00106b62:
      main_cold_13();
LAB_00106b6e:
      main_cold_11();
      goto LAB_00106b73;
    }
    setup_log_event_ls._0_8_ = log_event_cb;
    pStack_10b68.log_event = (ptls_log_event_t *)setup_log_event_ls;
    goto LAB_00106079;
  case 0x6e:
    uStack_10bc0 = uStack_10bc0 | 0x100000000;
    goto LAB_00106079;
  case 0x73:
    strcpy(setup_session_file_st + 8,_optarg);
    setup_session_file_st._0_8_ = util_save_ticket_cb;
    pStack_10b68.save_ticket = (ptls_save_ticket_t *)setup_session_file_st;
    pFVar10 = fopen(pcVar1,"rb");
    if (pFVar10 != (FILE *)0x0) {
      ppcVar12 = (char **)fread(setup_session_file_ticket,1,0x4000,pFVar10);
      if ((ppcVar12 == (char **)0x0) || (iVar7 = feof(pFVar10), ppcVar21 = ppcVar12, iVar7 == 0)) {
        main_cold_5();
switchD_001060b1_caseD_68:
        usage(*ppcVar21);
        exit(0);
      }
      fclose(pFVar10);
      auStack_10be8._16_8_ = setup_session_file_ticket;
      auStack_10be8._24_8_ = ppcVar12;
    }
    goto LAB_00106079;
  case 0x75:
    request_key_update = 1;
    goto LAB_00106079;
  case 0x76:
    ptls_openssl_init_verify_certificate
              ((ptls_openssl_verify_certificate_t *)setup_verify_certificate_vc,(X509_STORE *)0x0);
    pStack_10b68.verify_certificate = (ptls_verify_certificate_t *)setup_verify_certificate_vc;
    goto LAB_00106079;
  default:
    if (iVar6 == 0x4e) {
      iVar7 = strcasecmp(_optarg,"secp256r1");
      if (iVar7 == 0) {
        ppVar19 = &ptls_openssl_secp256r1;
      }
      else {
        iVar7 = strcasecmp(pcVar1,"secp384r1");
        if (iVar7 == 0) {
          ppVar19 = &ptls_openssl_secp384r1;
        }
        else {
          ppVar19 = (ptls_key_exchange_algorithm_t *)0x0;
        }
      }
      if (ppVar19 == (ptls_key_exchange_algorithm_t *)0x0) {
        iVar7 = strcasecmp(pcVar1,"secp521r1");
        if (iVar7 == 0) {
          ppVar19 = &ptls_openssl_secp521r1;
        }
        else {
          ppVar19 = (ptls_key_exchange_algorithm_t *)0x0;
        }
      }
      if (ppVar19 == (ptls_key_exchange_algorithm_t *)0x0) {
        iVar7 = strcasecmp(pcVar1,"x25519");
        if (iVar7 == 0) {
          ppVar19 = &ptls_openssl_x25519;
        }
        else {
          ppVar19 = (ptls_key_exchange_algorithm_t *)0x0;
        }
      }
      if (ppVar19 == (ptls_key_exchange_algorithm_t *)0x0) {
        fprintf(_stderr,"could not find key exchange: %s\n",pcVar1);
        iStack_10c30 = 1;
      }
      else {
        pppVar4 = appStack_10838;
        do {
          pppVar13 = pppVar4;
          pppVar4 = pppVar13 + 1;
        } while (*pppVar13 != (ptls_key_exchange_algorithm_t *)0x0);
        *pppVar13 = ppVar19;
      }
      if (ppVar19 == (ptls_key_exchange_algorithm_t *)0x0) {
        return iStack_10c30;
      }
      goto LAB_00106079;
    }
    if (iVar6 == 0x53) {
      pStack_10b68._104_1_ = pStack_10b68._104_1_ | 1;
      goto LAB_00106079;
    }
  }
switchD_001060b1_caseD_64:
  exit(1);
  while( true ) {
    memmove(__dest,pbVar20,__n);
    __dest = __dest + __n;
    pbVar20 = pbVar20 + __n;
    if (pbVar20 == local_fc28 + local_fc2c) break;
LAB_00106a5c:
    __n = (ulong)*pbVar20;
    pbVar20 = pbVar20 + 1;
    if ((ulong)((long)(local_fc28 + local_fc2c) - (long)pbVar20) < __n) goto LAB_001068db;
  }
  *__dest = 0;
  ptls_base64_decode_init(&pStack_10aa0);
  iVar8 = ptls_base64_decode((char *)local_fc28,&pStack_10aa0,&pStack_10c08);
  if (iVar8 == 0) {
    if (pStack_10c08.is_allocated == 0) {
LAB_00106b73:
      __assert_fail("decode_buf.is_allocated",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/util.h",
                    0x141,"ptls_iovec_t resolve_esni_keys(const char *)");
    }
  }
  else {
LAB_001068db:
    ptls_buffer__release_memory(&pStack_10c08);
    pStack_10c08.off = 0;
    pStack_10c08._24_8_ = 0;
    pStack_10c08.base = (uint8_t *)0x0;
    pStack_10c08.capacity = 0;
  }
  uStack_10bb8 = pStack_10c08.base;
  uStack_10bb0 = pStack_10c08.off;
  iVar8 = socket((uint)asStack_10a90[0].sa_family,1,0);
  if (iVar8 == 1) {
LAB_001069ad:
    pcVar16 = "socket(2) failed";
LAB_00106a03:
    iStack_10c30 = 1;
    perror(pcVar16);
  }
  else {
    iVar7 = connect(iVar8,asStack_10a90,sStack_10c2c);
    if (iVar7 == 0) {
      iStack_10c30 = handle_connection(iVar8,&pStack_10b68,pcVar1,pcVar16,
                                       (ptls_handshake_properties_t *)auStack_10be8,
                                       request_key_update);
      free((void *)uStack_10bb8);
    }
    else {
      perror("connect(2) failed");
LAB_00106aea:
      iStack_10c30 = 1;
    }
  }
  return iStack_10c30;
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    res_init();

    ptls_key_exchange_algorithm_t *key_exchanges[128] = {NULL};
    ptls_context_t ctx = {ptls_openssl_random_bytes, &ptls_get_time, key_exchanges, ptls_openssl_cipher_suites};
    ptls_handshake_properties_t hsprop = {{{{NULL}}}};
    const char *host, *port, *file = NULL, *esni_file = NULL;
    struct {
        ptls_key_exchange_context_t *elements[16];
        size_t count;
    } esni_key_exchanges;
    int is_server = 0, use_early_data = 0, request_key_update = 0, ch;
    struct sockaddr_storage sa;
    socklen_t salen;
    int family = 0;

    while ((ch = getopt(argc, argv, "46abC:c:i:k:nN:es:SE:K:l:vh")) != -1) {
        switch (ch) {
        case '4':
            family = AF_INET;
            break;
        case '6':
            family = AF_INET6;
            break;
        case 'a':
            ctx.require_client_authentication = 1;
            break;
        case 'b':
#if PICOTLS_USE_BROTLI
            ctx.decompress_certificate = &ptls_decompress_certificate;
#else
            fprintf(stderr, "support for `-b` option was turned off during configuration\n");
            exit(1);
#endif
            break;
        case 'C':
        case 'c':
            if (ctx.certificates.count != 0) {
                fprintf(stderr, "-C/-c can only be specified once\n");
                return 1;
            }
            load_certificate_chain(&ctx, optarg);
            is_server = ch == 'c';
            break;
        case 'i':
            file = optarg;
            break;
        case 'k':
            load_private_key(&ctx, optarg);
            break;
        case 'n':
            hsprop.client.negotiate_before_key_exchange = 1;
            break;
        case 'e':
            use_early_data = 1;
            break;
        case 's':
            setup_session_file(&ctx, &hsprop, optarg);
            break;
        case 'S':
            ctx.require_dhe_on_psk = 1;
            break;
        case 'E':
            esni_file = optarg;
            break;
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;
            int ret;
            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open ESNI private key file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                return 1;
            }
            if ((ret = ptls_openssl_create_key_exchange(esni_key_exchanges.elements + esni_key_exchanges.count++, pkey)) != 0) {
                fprintf(stderr, "failed to load private key from file:%s:picotls-error:%d", optarg, ret);
                return 1;
            }
            EVP_PKEY_free(pkey);
            fclose(fp);
        } break;
        case 'l':
            setup_log_event(&ctx, optarg);
            break;
        case 'v':
            setup_verify_certificate(&ctx);
            break;
        case 'N': {
            ptls_key_exchange_algorithm_t *algo = NULL;
#define MATCH(name)                                                                                                                \
    if (algo == NULL && strcasecmp(optarg, #name) == 0)                                                                            \
    algo = (&ptls_openssl_##name)
            MATCH(secp256r1);
#if PTLS_OPENSSL_HAVE_SECP384R1
            MATCH(secp384r1);
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
            MATCH(secp521r1);
#endif
#if PTLS_OPENSSL_HAVE_X25519
            MATCH(x25519);
#endif
#undef MATCH
            if (algo == NULL) {
                fprintf(stderr, "could not find key exchange: %s\n", optarg);
                return 1;
            }
            size_t i;
            for (i = 0; key_exchanges[i] != NULL; ++i)
                ;
            key_exchanges[i++] = algo;
        } break;
        case 'u':
            request_key_update = 1;
            break;
        case 'h':
            usage(argv[0]);
            exit(0);
        default:
            exit(1);
        }
    }
    argc -= optind;
    argv += optind;
    if ((ctx.certificates.count == 0) != (ctx.sign_certificate == NULL)) {
        fprintf(stderr, "-C/-c and -k options must be used together\n");
        return 1;
    }
    if (is_server) {
        if (ctx.certificates.count == 0) {
            fprintf(stderr, "-c and -k options must be set\n");
            return 1;
        }
#if PICOTLS_USE_BROTLI
        if (ctx.decompress_certificate != NULL) {
            static ptls_emit_compressed_certificate_t ecc;
            if (ptls_init_compressed_certificate(&ecc, ctx.certificates.list, ctx.certificates.count, ptls_iovec_init(NULL, 0)) !=
                0) {
                fprintf(stderr, "failed to create a brotli-compressed version of the certificate chain.\n");
                exit(1);
            }
            ctx.emit_certificate = &ecc.super;
        }
#endif
        setup_session_cache(&ctx);
    } else {
        /* client */
        if (use_early_data) {
            static size_t max_early_data_size;
            hsprop.client.max_early_data_size = &max_early_data_size;
        }
    }
    if (key_exchanges[0] == NULL)
        key_exchanges[0] = &ptls_openssl_secp256r1;
    if (esni_file != NULL) {
        if (esni_key_exchanges.count == 0) {
            fprintf(stderr, "-E must be used together with -K\n");
            return 1;
        }
        setup_esni(&ctx, esni_file, esni_key_exchanges.elements);
    }
    if (argc != 2) {
        fprintf(stderr, "missing host and port\n");
        return 1;
    }
    host = (--argc, *argv++);
    port = (--argc, *argv++);

    if (resolve_address((struct sockaddr *)&sa, &salen, host, port, family, SOCK_STREAM, IPPROTO_TCP) != 0)
        exit(1);

    if (is_server) {
        return run_server((struct sockaddr *)&sa, salen, &ctx, file, &hsprop, request_key_update);
    } else {
        return run_client((struct sockaddr *)&sa, salen, &ctx, host, file, &hsprop, request_key_update);
    }
}